

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O0

void __thiscall roaring::Roaring::Roaring(Roaring *this,Roaring *r)

{
  _Bool _Var1;
  runtime_error *this_00;
  roaring_bitmap_t *in_RSI;
  roaring_bitmap_t *in_RDI;
  Roaring *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  roaring_bitmap_t *in_stack_ffffffffffffffd0;
  
  Roaring(in_stack_ffffffffffffffc0);
  _Var1 = roaring_bitmap_overwrite
                    (in_stack_ffffffffffffffd0,
                     (roaring_bitmap_t *)
                     CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  if (!_Var1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"failed roaring_bitmap_overwrite in constructor");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  _Var1 = roaring_bitmap_get_copy_on_write(in_RSI);
  roaring_bitmap_set_copy_on_write(in_RDI,_Var1);
  return;
}

Assistant:

Roaring(const Roaring &r) : Roaring() {
        if (!api::roaring_bitmap_overwrite(&roaring, &r.roaring)) {
            ROARING_TERMINATE("failed roaring_bitmap_overwrite in constructor");
        }
        api::roaring_bitmap_set_copy_on_write(
            &roaring, api::roaring_bitmap_get_copy_on_write(&r.roaring));
    }